

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

reference __thiscall
jsoncons::jsonpath::detail::
recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *param_6)

{
  bool bVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  size_t sVar2;
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  receiver;
  allocator<char> local_51;
  path_node_type *local_50;
  fd_set *local_48;
  timeval local_40;
  
  local_40.tv_sec = local_40.tv_sec & 0xffffffffffffff00;
  local_50 = last;
  local_48 = (fd_set *)current;
  this_00 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            ::
            create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
                      ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                        *)context,(json_array_arg_t *)&json_array_arg,(semantic_tag *)&local_40,
                       &local_51);
  local_40.tv_sec = (__time_t)&PTR__node_receiver_00b61fa0;
  local_40.tv_usec = (__suseconds_t)this_00;
  select(this,(int)context,(fd_set *)root,(fd_set *)local_50,local_48,&local_40);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(this_00);
  if (bVar1) {
    this_00 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::null_value(context);
  }
  else {
    sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
    if (sVar2 == 1) {
      this_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,0);
    }
  }
  return this_00;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current, 
            result_options options,
            std::error_code&) const override
        {
            auto jptr = context.create_json(json_array_arg, semantic_tag::none, context.get_allocator());
            json_array_receiver<Json,JsonReference> receiver(jptr);
            select(context, root, last, current, receiver, options);
            if (jptr->empty())
            {
                return context.null_value();
            }
            return jptr->size() == 1 ? (*jptr)[0] : *jptr;
        }